

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::insert
          (QMovableArrayOps<QByteArray> *this,qsizetype i,qsizetype n,parameter_type t)

{
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  QByteArray copy;
  QByteArray *in_stack_ffffffffffffff68;
  QArrayDataPointer<QByteArray> *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff80;
  uint uVar1;
  byte bVar2;
  undefined4 in_stack_ffffffffffffff84;
  GrowthPosition in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar3;
  long local_60;
  Inserter local_48;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar1 = in_stack_ffffffffffffff80 & 0xffffff;
  if (in_RDI->size != 0) {
    uVar1 = CONCAT13(in_RSI == 0,(int3)in_stack_ffffffffffffff80);
  }
  bVar2 = (byte)(uVar1 >> 0x18);
  uVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff94);
  QArrayDataPointer<QByteArray>::detachAndGrow
            ((QArrayDataPointer<QByteArray> *)CONCAT44(uVar3,(uint)bVar2),in_stack_ffffffffffffff8c,
             CONCAT44(in_stack_ffffffffffffff84,uVar1),(QByteArray **)in_RDI,
             in_stack_ffffffffffffff70);
  local_60 = in_RDX;
  if ((uVar3 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(in_stack_ffffffffffffff84,uVar1),in_RDI,
                       (qsizetype)in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    Inserter::insertFill
              ((Inserter *)CONCAT44(in_stack_ffffffffffffff84,uVar1),(QByteArray *)in_RDI,
               (qsizetype)in_stack_ffffffffffffff70);
    Inserter::~Inserter(&local_48);
  }
  else {
    while (local_60 != 0) {
      QArrayDataPointer<QByteArray>::begin((QArrayDataPointer<QByteArray> *)0x3c8e3f);
      QByteArray::QByteArray((QByteArray *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      local_60 = local_60 + -1;
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x3c8eed);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }